

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O1

string * zpsoe::zlog::get_current_date_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  time_t t;
  char buf [80];
  time_t local_70;
  char local_68 [88];
  
  local_70 = time((time_t *)0x0);
  __tp = localtime(&local_70);
  strftime(local_68,0x50,"%Y-%m-%d %H:%M:%S",__tp);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_68);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

string get_current_date() {
    char buf[80];
    time_t t = time(NULL);
    strftime(buf, 80, "%Y-%m-%d %H:%M:%S", localtime(&t));
    return string(buf);
}